

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool flatbuffers::SetGlobalTestLocale(char *locale_name,string *_value)

{
  char *__s;
  allocator<char> local_49;
  string local_48 [32];
  char *local_28;
  char *the_locale;
  string *_value_local;
  char *locale_name_local;
  
  the_locale = (char *)_value;
  _value_local = (string *)locale_name;
  __s = setlocale(6,locale_name);
  if (__s == (char *)0x0) {
    locale_name_local._7_1_ = false;
  }
  else {
    if (the_locale != (char *)0x0) {
      local_28 = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
      std::__cxx11::string::operator=((string *)the_locale,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    locale_name_local._7_1_ = true;
  }
  return locale_name_local._7_1_;
}

Assistant:

bool SetGlobalTestLocale(const char *locale_name, std::string *_value) {
  const auto the_locale = setlocale(LC_ALL, locale_name);
  if (!the_locale) return false;
  if (_value) *_value = std::string(the_locale);
  return true;
}